

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Clean(StorageErrorsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_to_1D != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_1D);
    this->m_to_1D = 0;
  }
  if (this->m_to_1D_array != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_1D_array);
    this->m_to_1D_array = 0;
  }
  if (this->m_to_2D != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D);
    this->m_to_2D = 0;
  }
  if (this->m_to_2D_array != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D_array);
    this->m_to_2D_array = 0;
  }
  if (this->m_to_3D != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_3D);
    this->m_to_3D = 0;
  }
  if (this->m_to_2D_ms != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D_ms);
    this->m_to_2D_ms = 0;
  }
  if (this->m_to_2D_ms_immutable != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D_ms_immutable);
    this->m_to_2D_ms_immutable = 0;
  }
  if (this->m_to_3D_ms != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_3D_ms);
    this->m_to_3D_ms = 0;
  }
  if (this->m_to_3D_ms_immutable != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_3D_ms_immutable);
    this->m_to_3D_ms_immutable = 0;
  }
  this->m_to_invalid = 0;
  this->m_internalformat_invalid = 0;
  this->m_max_texture_size = 1;
  this->m_max_samples = 1;
  this->m_max_array_texture_layers = 1;
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void StorageErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_to_1D)
	{
		gl.deleteTextures(1, &m_to_1D);

		m_to_1D = 0;
	}

	if (m_to_1D_array)
	{
		gl.deleteTextures(1, &m_to_1D_array);

		m_to_1D_array = 0;
	}

	if (m_to_2D)
	{
		gl.deleteTextures(1, &m_to_2D);

		m_to_2D = 0;
	}

	if (m_to_2D_array)
	{
		gl.deleteTextures(1, &m_to_2D_array);

		m_to_2D_array = 0;
	}

	if (m_to_3D)
	{
		gl.deleteTextures(1, &m_to_3D);

		m_to_3D = 0;
	}

	if (m_to_2D_ms)
	{
		gl.deleteTextures(1, &m_to_2D_ms);

		m_to_2D_ms = 0;
	}

	if (m_to_2D_ms_immutable)
	{
		gl.deleteTextures(1, &m_to_2D_ms_immutable);

		m_to_2D_ms_immutable = 0;
	}

	if (m_to_3D_ms)
	{
		gl.deleteTextures(1, &m_to_3D_ms);

		m_to_3D_ms = 0;
	}

	if (m_to_3D_ms_immutable)
	{
		gl.deleteTextures(1, &m_to_3D_ms_immutable);

		m_to_3D_ms_immutable = 0;
	}

	m_to_invalid			   = 0;
	m_internalformat_invalid   = 0;
	m_max_texture_size		   = 1;
	m_max_samples			   = 1;
	m_max_array_texture_layers = 1;

	while (GL_NO_ERROR != gl.getError())
		;
}